

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O1

int IteratorCubePairNext(void)

{
  que *pqVar1;
  Cube **ppCVar2;
  Cube **ppCVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  iVar6 = s_Iter_4;
  iVar5 = s_nPosAlloc;
  if (s_Iter_0 == '\0') {
    __assert_fail("s_Iter.fStarted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                  ,0x435,"int IteratorCubePairNext()");
  }
  uVar7 = (ulong)s_Iter_1;
  pqVar1 = s_Que + uVar7;
  iVar9 = s_Que[uVar7].PosOut;
  iVar8 = 0;
  bVar10 = iVar9 == s_Iter_4;
  pQ = pqVar1;
  if (!bVar10) {
    ppCVar2 = pqVar1->pC1;
    ppCVar3 = s_Que[uVar7].pC2;
    pbVar4 = s_Que[uVar7].ID1;
    do {
      p1 = ppCVar2[iVar9];
      p2 = ppCVar3[iVar9];
      if ((p1->ID == pbVar4[iVar9]) && (p2->ID == s_Que[uVar7].ID2[iVar9])) {
        iVar8 = 1;
        goto LAB_0034cb9e;
      }
      iVar9 = (iVar9 + 1) % iVar5;
      s_Que[uVar7].PosOut = iVar9;
      bVar10 = iVar9 == iVar6;
    } while (!bVar10);
    iVar8 = 0;
  }
LAB_0034cb9e:
  if (bVar10) {
    s_Iter_0 = '\0';
  }
  else {
    *s_Iter_2 = pqVar1->pC1[iVar9];
    *s_Iter_3 = s_Que[uVar7].pC2[iVar9];
    s_Que[uVar7].PosOut = (iVar9 + 1) % s_nPosAlloc;
  }
  return iVar8;
}

Assistant:

int IteratorCubePairNext()
// gives the next VALID cube pair (the previous one is automatically dequequed)
{
    int fEntryFound = 0;
    assert( s_Iter.fStarted );

    // go through the entries while there is something in the queque
    for ( pQ = &s_Que[ s_Iter.Dist ]; pQ->PosOut != s_Iter.PosStop; pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc )
    {
        p1 = pQ->pC1[ pQ->PosOut ];
        p2 = pQ->pC2[ pQ->PosOut ];

        // check whether the entry is valid
        if ( p1->ID == pQ->ID1[ pQ->PosOut ] && 
             p2->ID == pQ->ID2[ pQ->PosOut ] ) //&&
             //p1->x + p1->y + p2->x + p2->y > s_Iter.CutValue )
        {
             fEntryFound = 1;
             break;
        }
    }

    if ( fEntryFound )
    { // write the result into the pick-up place
        *(s_Iter.ppC1) = pQ->pC1[ pQ->PosOut ];
        *(s_Iter.ppC2) = pQ->pC2[ pQ->PosOut ];

        pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc;
    }
    else // iteration has finished
        s_Iter.fStarted = 0;

    return fEntryFound;
}